

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation_Management_Header.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Simulation_Management_Header::Simulation_Management_Header
          (Simulation_Management_Header *this,Simulation_Management_Header *H)

{
  Simulation_Management_Header *H_local;
  Simulation_Management_Header *this_local;
  
  Header7::Header7(&this->super_Header,&H->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Simulation_Management_Header_0032ac00;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_OriginatingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReceivingEntityID);
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x05';
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Simulation_Management_Header::Simulation_Management_Header( const Simulation_Management_Header & H ) :
        Header(H) {
    m_ui8ProtocolFamily = Simulation_Management;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}